

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8str(void *haystack,void *needle)

{
  char *pcVar1;
  char *n;
  char *maybeMatch;
  char *h;
  void *needle_local;
  void *haystack_local;
  void *local_8;
  
  h = (char *)haystack;
  local_8 = haystack;
  if (*needle != '\0') {
    while (pcVar1 = h, n = (char *)needle, *h != '\0') {
      for (; *h == *n; h = h + 1) {
        n = n + 1;
      }
      if (*n == '\0') {
        return pcVar1;
      }
      if (*h != '\0') {
        do {
          h = h + 1;
        } while (((int)*h & 0xc0U) == 0x80);
      }
    }
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *utf8str(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    while (*h == *n) {
      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}